

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrdb.cpp
# Opt level: O0

bool DumpPeerAddresses(ArgsManager *args,AddrMan *addr)

{
  long lVar1;
  byte bVar2;
  allocator<char> *in_RDI;
  long in_FS_OFFSET;
  path pathAddr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff38;
  ArgsManager *in_stack_ffffffffffffff40;
  undefined7 in_stack_ffffffffffffff48;
  undefined1 in_stack_ffffffffffffff4f;
  path *in_stack_ffffffffffffff50;
  char *in_stack_ffffffffffffff80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff88;
  AddrMan *in_stack_ffffffffffffffd0;
  path *in_stack_ffffffffffffffd8;
  string *in_stack_ffffffffffffffe0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ArgsManager::GetDataDirNet(in_stack_ffffffffffffff40);
  fs::operator/(in_stack_ffffffffffffff50,
                (char *)CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48));
  fs::path::~path((path *)in_stack_ffffffffffffff38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,in_RDI);
  bVar2 = anon_unknown.dwarf_176a0eb::SerializeFileDB<AddrMan>
                    (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  std::__cxx11::string::~string(in_stack_ffffffffffffff38);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff87);
  fs::path::~path((path *)in_stack_ffffffffffffff38);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (bool)(bVar2 & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool DumpPeerAddresses(const ArgsManager& args, const AddrMan& addr)
{
    const auto pathAddr = args.GetDataDirNet() / "peers.dat";
    return SerializeFileDB("peers", pathAddr, addr);
}